

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cc
# Opt level: O0

Arbiter * apollonia::Collide(PolygonBody *pa,PolygonBody *pb)

{
  initializer_list<apollonia::Contact> __l;
  reference pCVar1;
  Vec2 VVar2;
  PolygonBody *this;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  Vec2 VVar6;
  ulong uVar7;
  PolygonBody *pPVar8;
  Vec2 *pVVar9;
  Vec2 local_204;
  Vec2 local_1fc;
  Vec2 local_1f4;
  Vec2 local_1ec;
  Vec2 local_1e4;
  Float local_1dc;
  reference pCStack_1d8;
  Float sep;
  Contact *contact;
  iterator __end1;
  iterator __begin1;
  ContactList *__range1;
  pointer pCStack_1b0;
  pointer local_1a8;
  PolygonBody *local_1a0;
  Arbiter *arbiter;
  Vec2 local_18c;
  Vec2 va;
  size_t num;
  Vec2 local_170;
  Vec2 v1;
  Vec2 local_160;
  Vec2 v0;
  size_t i;
  ContactList clipped_contacts;
  allocator<apollonia::Contact> local_121;
  Contact local_120;
  Contact local_d8;
  Contact *local_90;
  size_type local_88;
  undefined1 local_80 [8];
  ContactList contacts;
  size_t next_idx;
  size_t idx;
  Vec2 local_50;
  Vec2 normal;
  PolygonBody *b;
  PolygonBody *a;
  Float sb;
  Float sa;
  size_t ib;
  size_t ia;
  PolygonBody *pb_local;
  PolygonBody *pa_local;
  
  ia = (size_t)pb;
  pb_local = pa;
  a._4_4_ = PolygonBody::FindMinSeparatingAxis(pa,&ib,pb);
  if (a._4_4_ < 0.0) {
    a._0_4_ = PolygonBody::FindMinSeparatingAxis((PolygonBody *)ia,(size_t *)&sb,pb_local);
    if (a._0_4_ < 0.0) {
      if (a._4_4_ < a._0_4_) {
        std::swap<float>((float *)((long)&a + 4),(float *)&a);
        std::swap<unsigned_long>(&ib,(unsigned_long *)&sb);
        std::swap<apollonia::PolygonBody*>(&pb_local,(PolygonBody **)&ia);
      }
      this = pb_local;
      normal.x = (Float)(undefined4)ia;
      normal.y = (Float)ia._4_4_;
      idx = (size_t)PolygonBody::EdgeAt(pb_local,ib);
      local_50 = Vec2::Normal((Vec2 *)&idx);
      sVar4 = FindIncidentEdge(&local_50,(PolygonBody *)normal);
      sVar5 = PolygonBody::Count((PolygonBody *)normal);
      contacts.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)((sVar4 + 1) % sVar5);
      Contact::Contact(&local_120,(PolygonBody *)normal,sVar4);
      Contact::Contact(&local_d8,(PolygonBody *)normal,
                       (size_t)contacts.
                               super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_88 = 2;
      local_90 = &local_120;
      std::allocator<apollonia::Contact>::allocator(&local_121);
      __l._M_len = local_88;
      __l._M_array = local_90;
      std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::vector
                ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)local_80,__l,
                 &local_121);
      std::allocator<apollonia::Contact>::~allocator(&local_121);
      std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::vector
                ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&i,
                 (vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)local_80);
      v0.x = 0.0;
      v0.y = 0.0;
      for (; VVar2 = v0, VVar6 = (Vec2)PolygonBody::Count(this), (ulong)VVar2 < (ulong)VVar6;
          v0 = (Vec2)((long)v0 + 1)) {
        if (v0 != (Vec2)ib) {
          v1 = PolygonBody::operator[](this,(size_t)v0);
          local_160 = Body::LocalToWorld(&this->super_Body,&v1);
          uVar7 = (long)v0 + 1;
          sVar4 = PolygonBody::Count(this);
          num = (size_t)PolygonBody::operator[](this,uVar7 % sVar4);
          local_170 = Body::LocalToWorld(&this->super_Body,(Vec2 *)&num);
          register0x00000000 =
               Clip((ContactList *)&i,(ContactList *)local_80,(size_t)v0,&local_160,&local_170);
          if (register0x00000000 < 2) {
            pa_local = (PolygonBody *)0x0;
            goto LAB_00125677;
          }
          if (register0x00000000 != 2) {
            __assert_fail("num == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/wgtdkp[P]apollonia/src/collision.cc"
                          ,0x52,"Arbiter *apollonia::Collide(PolygonBody *, PolygonBody *)");
          }
          std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::operator=
                    ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)local_80,
                     (vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&i);
        }
      }
      unique0x100003dd = PolygonBody::operator[](this,ib);
      local_18c = Body::LocalToWorld(&this->super_Body,(Vec2 *)((long)&arbiter + 4));
      VVar2 = normal;
      __range1 = (ContactList *)0x0;
      pCStack_1b0 = (pointer)0x0;
      local_1a8 = (pointer)0x0;
      std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::vector
                ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&__range1);
      pPVar8 = (PolygonBody *)
               World::NewArbiter(&this->super_Body,(Body *)VVar2,&local_50,
                                 (vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)
                                 &__range1);
      std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::~vector
                ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&__range1);
      local_1a0 = pPVar8;
      __end1 = std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::begin
                         ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&i);
      contact = (Contact *)
                std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::end
                          ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&i);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<apollonia::Contact_*,_std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>_>
                                         *)&contact), bVar3) {
        pCStack_1d8 = __gnu_cxx::
                      __normal_iterator<apollonia::Contact_*,_std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>_>
                      ::operator*(&__end1);
        local_1e4 = operator-(&pCStack_1d8->position,&local_18c);
        local_1dc = Dot(&local_1e4,&local_50);
        pCVar1 = pCStack_1d8;
        if (local_1dc <= 0.0) {
          pCStack_1d8->separation = local_1dc;
          pVVar9 = Body::centroid(&this->super_Body);
          local_1f4 = Body::LocalToWorld(&this->super_Body,pVVar9);
          local_1ec = operator-(&pCVar1->position,&local_1f4);
          VVar2 = normal;
          pCVar1 = pCStack_1d8;
          pCStack_1d8->ra = local_1ec;
          pVVar9 = Body::centroid((Body *)normal);
          local_204 = Body::LocalToWorld((Body *)VVar2,pVVar9);
          local_1fc = operator-(&pCVar1->position,&local_204);
          pCStack_1d8->rb = local_1fc;
          Arbiter::AddContact((Arbiter *)local_1a0,pCStack_1d8);
        }
        __gnu_cxx::
        __normal_iterator<apollonia::Contact_*,_std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>_>
        ::operator++(&__end1);
      }
      pa_local = local_1a0;
LAB_00125677:
      va.x = 1.4013e-45;
      std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::~vector
                ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&i);
      std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::~vector
                ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)local_80);
    }
    else {
      pa_local = (PolygonBody *)0x0;
    }
  }
  else {
    pa_local = (PolygonBody *)0x0;
  }
  return (Arbiter *)pa_local;
}

Assistant:

Arbiter* Collide(PolygonBody* pa, PolygonBody* pb) {
  size_t ia, ib;
  Float sa, sb;
  if ((sa = pa->FindMinSeparatingAxis(ia, *pb)) >= 0) {
    return nullptr;
  }
  if ((sb = pb->FindMinSeparatingAxis(ib, *pa)) >= 0) {
    return nullptr;
  }
  if (sa < sb) {
    std::swap(sa, sb);
    std::swap(ia, ib);
    std::swap(pa, pb);
  }
  auto& a = *pa;
  auto& b = *pb;
  auto normal = a.EdgeAt(ia).Normal();
  auto idx = FindIncidentEdge(normal, b);
  auto next_idx = (idx + 1) % b.Count();
  Arbiter::ContactList contacts = {{b, idx}, {b, next_idx}};
  auto clipped_contacts = contacts;
  for (size_t i = 0; i < a.Count(); ++i) {
    if (i == ia) {
      continue;
    }
    auto v0 = a.LocalToWorld(a[i]);
    auto v1 = a.LocalToWorld(a[(i+1)%a.Count()]);
    auto num = Clip(clipped_contacts, contacts, i, v0, v1);
    if (num < 2) {
      return nullptr;
    }
    assert(num == 2);
    contacts = clipped_contacts;
  }

  auto va = a.LocalToWorld(a[ia]);
  auto arbiter = World::NewArbiter(a, b, normal);
  for (auto& contact : clipped_contacts) {
    auto sep = Dot(contact.position - va, normal);
    if (sep <= 0) {
      contact.separation = sep;
      contact.ra = contact.position - a.LocalToWorld(a.centroid());
      contact.rb = contact.position - b.LocalToWorld(b.centroid());
      arbiter->AddContact(contact);
    }
  }
  return arbiter;
}